

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O2

int Dau_InsertFunction(Abc_TtHieMan_t *pMan,word *pCur,int nNodes,int nInputs,int nVars0,int nVars,
                      Vec_Mem_t *vTtMem,Vec_Int_t *vNodSup,int nFronts,abctime clk)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  word wVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  byte bVar12;
  ulong uVar13;
  word (*pawVar14) [3];
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  word *pwVar20;
  word *pwVar21;
  word *pwVar22;
  ulong uVar23;
  word *pwVar24;
  word *pwVar25;
  uint nVars_00;
  char Perm [16];
  
  Perm[0] = '\0';
  Perm[1] = '\0';
  Perm[2] = '\0';
  Perm[3] = '\0';
  Perm[4] = '\0';
  Perm[5] = '\0';
  Perm[6] = '\0';
  Perm[7] = '\0';
  Perm[8] = '\0';
  Perm[9] = '\0';
  Perm[10] = '\0';
  Perm[0xb] = '\0';
  Perm[0xc] = '\0';
  Perm[0xd] = '\0';
  Perm[0xe] = '\0';
  Perm[0xf] = '\0';
  if (nInputs < nVars) {
    __assert_fail("nVars <= nVarsAll",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x75b,"int Abc_TtMinBase(word *, int *, int, int)");
  }
  uVar6 = 1 << ((char)nInputs - 6U & 0x1f);
  uVar9 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar9 = 0;
  }
  uVar10 = 0;
  if (0 < nVars) {
    uVar10 = (ulong)(uint)nVars;
  }
  uVar13 = 0;
  nVars_00 = 0;
  while( true ) {
    if (uVar13 == uVar10) break;
    iVar7 = Abc_TtHasVar(pCur,nInputs,(int)uVar13);
    if (iVar7 != 0) {
      lVar16 = (long)(int)nVars_00;
      if (lVar16 < (long)uVar13) {
        bVar11 = (byte)nVars_00;
        bVar12 = (byte)uVar13;
        if (nInputs < 7) {
          uVar17 = *pCur;
          bVar12 = (char)(-1 << (bVar11 & 0x1f)) + (char)(1 << (bVar12 & 0x1f));
          *pCur = (uVar17 & s_PPMasks[lVar16][uVar13][2]) >> (bVar12 & 0x3f) |
                  (s_PPMasks[lVar16][uVar13][1] & uVar17) << (bVar12 & 0x3f) |
                  s_PPMasks[lVar16][uVar13][0] & uVar17;
        }
        else if (uVar13 < 6) {
          pawVar14 = s_PPMasks[lVar16] + uVar13;
          bVar12 = (char)(-1 << (bVar11 & 0x1f)) + (char)(1 << (bVar12 & 0x1f));
          for (uVar17 = 0; uVar9 != uVar17; uVar17 = uVar17 + 1) {
            uVar23 = pCur[uVar17];
            pCur[uVar17] = (uVar23 & (*pawVar14)[2]) >> (bVar12 & 0x3f) |
                           ((*pawVar14)[1] & uVar23) << (bVar12 & 0x3f) | (*pawVar14)[0] & uVar23;
          }
        }
        else if ((int)nVars_00 < 6) {
          uVar19 = 1 << (bVar12 - 6 & 0x1f);
          iVar7 = 2 << (bVar12 - 6 & 0x1f);
          uVar17 = 0;
          if (0 < (int)uVar19) {
            uVar17 = (ulong)uVar19;
          }
          pwVar21 = pCur + (int)uVar19;
          for (pwVar22 = pCur; pwVar22 < pCur + (int)uVar6; pwVar22 = pwVar22 + iVar7) {
            for (uVar23 = 0; uVar17 != uVar23; uVar23 = uVar23 + 1) {
              uVar1 = pwVar22[uVar23];
              uVar2 = s_Truths6[lVar16];
              bVar12 = (byte)(1 << (bVar11 & 0x1f));
              uVar3 = pwVar21[uVar23];
              pwVar22[uVar23] = (uVar3 << (bVar12 & 0x3f) ^ uVar1) & uVar2 ^ uVar1;
              pwVar21[uVar23] = uVar3 & uVar2 | (uVar2 & uVar1) >> (bVar12 & 0x3f);
            }
            pwVar21 = pwVar21 + iVar7;
          }
        }
        else {
          bVar5 = bVar11 - 6 & 0x1f;
          uVar19 = 1 << bVar5;
          iVar7 = 2 << (bVar12 - 6 & 0x1f);
          uVar17 = 0;
          if (0 < 1 << bVar5) {
            uVar17 = (ulong)uVar19;
          }
          lVar16 = (long)(2 << (bVar11 - 6 & 0x1f));
          lVar18 = (long)(1 << (bVar12 - 6 & 0x1f));
          pwVar21 = pCur + lVar18;
          pwVar22 = pCur + (int)uVar19;
          for (pwVar25 = pCur; pwVar25 < pCur + (int)uVar6; pwVar25 = pwVar25 + iVar7) {
            pwVar20 = pwVar21;
            pwVar24 = pwVar22;
            for (lVar15 = 0; lVar15 < lVar18; lVar15 = lVar15 + lVar16) {
              for (uVar23 = 0; uVar17 != uVar23; uVar23 = uVar23 + 1) {
                wVar4 = pwVar24[uVar23];
                pwVar24[uVar23] = pwVar20[uVar23];
                pwVar20[uVar23] = wVar4;
              }
              pwVar20 = pwVar20 + lVar16;
              pwVar24 = pwVar24 + lVar16;
            }
            pwVar21 = pwVar21 + iVar7;
            pwVar22 = pwVar22 + iVar7;
          }
        }
      }
      nVars_00 = nVars_00 + 1;
    }
    uVar13 = uVar13 + 1;
  }
  if ((int)nVars_00 <= nVars) {
    Abc_TtCanonicizeWrap(Abc_TtCanonicizeAda,pMan,pCur,nVars_00,Perm,99);
    iVar7 = vTtMem->nEntries;
    Vec_MemHashInsert(vTtMem,pCur);
    iVar8 = 0;
    if (iVar7 != vTtMem->nEntries) {
      Vec_IntPush(vNodSup,nVars_00 | nNodes << 0x10);
      if (vTtMem->nEntries != vNodSup->nSize) {
        __assert_fail("Vec_MemEntryNum(vTtMem) == Vec_IntSize(vNodSup)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNpn.c"
                      ,0x269,
                      "int Dau_InsertFunction(Abc_TtHieMan_t *, word *, int, int, int, int, Vec_Mem_t *, Vec_Int_t *, int, abctime)"
                     );
      }
      if (vTtMem->nEntries % 1000000 == 0) {
        Dau_TablesSave(nInputs,nVars0,vTtMem,vNodSup,nFronts,clk);
      }
      iVar8 = 1;
    }
    return iVar8;
  }
  __assert_fail("k < nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                ,0x769,"int Abc_TtMinBase(word *, int *, int, int)");
}

Assistant:

int Dau_InsertFunction( Abc_TtHieMan_t * pMan, word * pCur, int nNodes, int nInputs, int nVars0, int nVars, 
    Vec_Mem_t * vTtMem, Vec_Int_t * vNodSup, int nFronts, abctime clk )
{
    int DumpDelta = 1000000;
    char Perm[16] = {0};
    int nVarsNew = Abc_TtMinBase( pCur, NULL, nVars, nInputs );
    //unsigned Phase = Abc_TtCanonicizeHie( pMan, pCur, nVarsNew, Perm, 1 );
    unsigned Phase = Abc_TtCanonicizeWrap( Abc_TtCanonicizeAda, pMan, pCur, nVarsNew, Perm, 99 );
    int nEntries = Vec_MemEntryNum(vTtMem);
    int Entry = Vec_MemHashInsert( vTtMem, pCur );
    if ( nEntries == Vec_MemEntryNum(vTtMem) ) // found in the table - not new
        return 0;
    Entry = 0;
    Phase = 0;
    // this is a new class
    Vec_IntPush( vNodSup, (nNodes << 16) | nVarsNew );
    assert( Vec_MemEntryNum(vTtMem) == Vec_IntSize(vNodSup) );
    if ( Vec_IntSize(vNodSup) % DumpDelta == 0 )
        Dau_TablesSave( nInputs, nVars0, vTtMem, vNodSup, nFronts, clk );
    return 1;
}